

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writePumps(ProjectWriter *this)

{
  double dVar1;
  Link *pLVar2;
  bool bVar3;
  int iVar4;
  _Setw _Var5;
  _Setprecision _Var6;
  vector<Link_*,_std::allocator<Link_*>_> *this_00;
  reference ppLVar7;
  ostream *poVar8;
  double dVar9;
  Pump *pump;
  Link *link;
  iterator __end1;
  iterator __begin1;
  vector<Link_*,_std::allocator<Link_*>_> *__range1;
  ProjectWriter *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[PUMPS]\n");
  this_00 = &this->network->links;
  __end1 = std::vector<Link_*,_std::allocator<Link_*>_>::begin(this_00);
  link = (Link *)std::vector<Link_*,_std::allocator<Link_*>_>::end(this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>
                                     *)&link), bVar3) {
    ppLVar7 = __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::
              operator*(&__end1);
    pLVar2 = *ppLVar7;
    iVar4 = (*(pLVar2->super_Element)._vptr_Element[2])();
    if (iVar4 == 1) {
      poVar8 = (ostream *)std::ostream::operator<<(&this->field_0x18,std::left);
      _Var5 = std::setw(0x10);
      poVar8 = std::operator<<(poVar8,_Var5);
      poVar8 = std::operator<<(poVar8,(string *)&(pLVar2->super_Element).name);
      std::operator<<(poVar8," ");
      _Var5 = std::setw(0x10);
      poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
      std::operator<<(poVar8,(string *)&(pLVar2->fromNode->super_Element).name);
      _Var5 = std::setw(0x10);
      poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
      std::operator<<(poVar8,(string *)&(pLVar2->toNode->super_Element).name);
      poVar8 = (ostream *)std::ostream::operator<<(&this->field_0x18,std::fixed);
      _Var6 = std::setprecision(4);
      std::operator<<(poVar8,_Var6);
      if (0.0 < *(double *)&pLVar2[1].super_Element.field_0x10) {
        _Var5 = std::setw(8);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        std::operator<<(poVar8,"POWER");
        _Var5 = std::setw(0xc);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        dVar1 = *(double *)&pLVar2[1].super_Element.field_0x10;
        dVar9 = Network::ucf(this->network,POWER);
        std::ostream::operator<<(poVar8,dVar1 * dVar9);
      }
      if (*(int *)&pLVar2[1].super_Element._vptr_Element != 0) {
        _Var5 = std::setw(8);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        std::operator<<(poVar8,"HEAD");
        _Var5 = std::setw(0x10);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        std::operator<<(poVar8,(string *)(*(long *)&pLVar2[1].super_Element.name + 8));
      }
      if ((0.0 < pLVar2[1].initSetting) &&
         ((pLVar2[1].initSetting != 1.0 || (NAN(pLVar2[1].initSetting))))) {
        _Var5 = std::setw(8);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        std::operator<<(poVar8,"SPEED");
        _Var5 = std::setw(8);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        std::ostream::operator<<(poVar8,pLVar2[1].initSetting);
      }
      if (*(long *)&pLVar2[1].status != 0) {
        _Var5 = std::setw(8);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        std::operator<<(poVar8,"PATTERN");
        _Var5 = std::setw(0x10);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        std::operator<<(poVar8,(string *)(*(long *)&pLVar2[1].status + 8));
      }
      std::operator<<((ostream *)&this->field_0x18,"\n");
    }
    __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writePumps()
{
    fout << "\n[PUMPS]\n";
    for (Link* link : network->links)
    {
        if ( link->type() == Link::PUMP )
        {
            Pump* pump = static_cast<Pump*>(link);
            fout << left << setw(16) << link->name << " ";
            fout << setw(16) << link->fromNode->name;
            fout << setw(16) << link->toNode->name;
            fout << fixed << setprecision(4);

            if ( pump->pumpCurve.horsepower > 0.0 )
            {
                fout << setw(8) << "POWER";
                fout << setw(12) << pump->pumpCurve.horsepower * network->ucf(Units::POWER);
            }

            if ( pump->pumpCurve.curveType != PumpCurve::NO_CURVE )
            {
                fout << setw(8) << "HEAD";
                fout << setw(16) << pump->pumpCurve.curve->name;
            }

            if ( pump->speed > 0.0 && pump->speed != 1.0 )
            {
                fout << setw(8) << "SPEED";
                fout << setw(8) << pump->speed;
            }

            if ( pump->speedPattern )
            {
                fout << setw(8) << "PATTERN";
                fout << setw(16) << pump->speedPattern->name;
            }
            fout << "\n";
        }
    }
}